

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::TextureCubeArrayFilteringCase::iterate
          (TextureCubeArrayFilteringCase *this)

{
  size_type *psVar1;
  pointer pfVar2;
  int *piVar3;
  ostringstream *poVar4;
  ostringstream *this_00;
  deUint32 dVar5;
  TestLog *log;
  pointer pFVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int y;
  bool bVar9;
  int iVar10;
  deUint32 dVar11;
  uint uVar12;
  SamplerType SVar13;
  undefined4 extraout_var;
  RenderTarget *renderTarget;
  undefined8 *puVar14;
  undefined4 extraout_var_00;
  NotSupportedError *this_01;
  byte bVar15;
  char *description;
  uint uVar16;
  ulong uVar17;
  qpTestResult testResult;
  ulong uVar18;
  TestContext *pTVar19;
  void *pvVar20;
  long lVar21;
  pointer pFVar22;
  undefined1 auVar23 [16];
  vector<float,_std::allocator<float>_> texCoord;
  Surface result;
  RandomViewport viewport;
  ulong local_3a0;
  LookupPrecision local_398;
  TestLog *local_360;
  TextureCubeArrayView local_358;
  float local_348;
  float local_344;
  float local_340;
  float local_33c;
  IVec4 coordBits;
  ulong local_328 [2];
  PixelFormat pixelFormat;
  ulong local_308 [2];
  LodPrecision local_2f4;
  RenderContext *local_2e8;
  long local_2e0;
  ScopedLogSection section;
  TextureFormat texFmt;
  undefined1 local_2a0 [100];
  int local_23c;
  anon_union_16_3_1194ccdc_for_v local_238;
  bool local_228;
  undefined7 uStack_227;
  LodMode local_220;
  undefined1 local_208 [112];
  ios_base local_198 [8];
  ios_base local_190 [264];
  IVec4 colorBits;
  TextureFormatInfo fmtInfo;
  
  local_360 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_2e8 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar10 = (*local_2e8->_vptr_RenderContext[3])();
  lVar21 = CONCAT44(extraout_var,iVar10);
  dVar11 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  uVar12 = ((uint)this->m_caseNdx >> 0x10 ^ this->m_caseNdx ^ 0x3d) * 9;
  uVar16 = (uVar12 >> 4 ^ uVar12) * 0x27d4eb2d;
  uVar12 = tcu::CommandLine::getBaseSeed
                     (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,renderTarget,0x1c,0x1c,dVar11 ^ uVar12 ^ uVar16 ^ uVar16 >> 0xf);
  iVar10 = this->m_caseNdx;
  pFVar22 = (this->m_cases).
            super__Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  texFmt = ((pFVar22[iVar10].texture)->m_refTexture).super_TextureLevelPyramid.m_format;
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  piVar3 = local_398.uvwBits.m_data + 1;
  local_398.coordBits.m_data._0_8_ = piVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
  std::ostream::operator<<(local_208,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
  std::ios_base::~ios_base(local_198);
  uVar17 = (long)result.m_pixels.m_ptr +
           CONCAT44(local_398.uvwBits.m_data[0],local_398.coordBits.m_data[2]);
  uVar18 = 0xf;
  if ((int *)local_398.coordBits.m_data._0_8_ != piVar3) {
    uVar18 = CONCAT44(local_398.uvwBits.m_data[2],local_398.uvwBits.m_data[1]);
  }
  if (uVar18 < uVar17) {
    uVar18 = 0xf;
    if ((size_t *)CONCAT44(result.m_height,result.m_width) != &result.m_pixels.m_cap) {
      uVar18 = result.m_pixels.m_cap;
    }
    if (uVar18 < uVar17) goto LAB_004a4420;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&result,0,(char *)0x0,local_398.coordBits.m_data._0_8_);
  }
  else {
LAB_004a4420:
    puVar14 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_398,(ulong)CONCAT44(result.m_height,result.m_width));
  }
  local_2a0._0_8_ = local_2a0 + 0x10;
  psVar1 = puVar14 + 2;
  if ((size_type *)*puVar14 == psVar1) {
    local_2a0._16_8_ = *psVar1;
    local_2a0._24_8_ = puVar14[3];
  }
  else {
    local_2a0._16_8_ = *psVar1;
    local_2a0._0_8_ = (size_type *)*puVar14;
  }
  local_2a0._8_8_ = puVar14[1];
  *puVar14 = psVar1;
  puVar14[1] = 0;
  *(undefined1 *)psVar1 = 0;
  pixelFormat._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelFormat,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
  std::ostream::operator<<(local_208,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
  std::ios_base::~ios_base(local_198);
  uVar17 = 0xf;
  if ((ulong *)pixelFormat._0_8_ != local_308) {
    uVar17 = local_308[0];
  }
  if (uVar17 < (ulong)(coordBits.m_data._8_8_ + pixelFormat._8_8_)) {
    uVar17 = 0xf;
    if ((ulong *)coordBits.m_data._0_8_ != local_328) {
      uVar17 = local_328[0];
    }
    if ((ulong)(coordBits.m_data._8_8_ + pixelFormat._8_8_) <= uVar17) {
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&coordBits,0,(char *)0x0,pixelFormat._0_8_);
      goto LAB_004a4589;
    }
  }
  puVar14 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&pixelFormat,coordBits.m_data._0_8_);
LAB_004a4589:
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  pfVar2 = (pointer)(puVar14 + 2);
  if ((pointer)*puVar14 == pfVar2) {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
  }
  else {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*puVar14;
  }
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)puVar14[1];
  *puVar14 = pfVar2;
  puVar14[1] = 0;
  *(undefined1 *)pfVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_2a0,(string *)&texCoord);
  if ((pointer *)
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((ulong *)coordBits.m_data._0_8_ != local_328) {
    operator_delete((void *)coordBits.m_data._0_8_,local_328[0] + 1);
  }
  if ((ulong *)pixelFormat._0_8_ != local_308) {
    operator_delete((void *)pixelFormat._0_8_,local_308[0] + 1);
  }
  if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  if ((size_t *)CONCAT44(result.m_height,result.m_width) != &result.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(result.m_height,result.m_width),result.m_pixels.m_cap + 1
                   );
  }
  if ((int *)local_398.coordBits.m_data._0_8_ != piVar3) {
    operator_delete((void *)local_398.coordBits.m_data._0_8_,
                    CONCAT44(local_398.uvwBits.m_data[2],local_398.uvwBits.m_data[1]) + 1);
  }
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_2a0,TEXTURETYPE_CUBE_ARRAY);
  if ((viewport.width < 0x1c) || (viewport.height < 0x1c)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Render target too small",SSBOArrayLengthTests::init::arraysSized + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFilteringTests.cpp"
               ,0x150);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)local_208,0x812f,0x812f,this->m_minFilter,this->m_magFilter);
  local_23c = local_208._32_4_;
  local_2a0._84_8_ = local_208._16_8_;
  local_2a0._92_8_ = local_208._24_8_;
  local_2a0._68_8_ = local_208._0_8_;
  local_2a0._76_8_ = local_208._8_8_;
  local_238._0_8_ = local_208._36_8_;
  local_238._8_8_ = local_208._44_8_;
  uStack_227 = SUB87(local_208._52_8_,1);
  local_228 = true;
  SVar13 = glu::TextureTestUtil::getSamplerType(texFmt);
  pFVar22 = pFVar22 + iVar10;
  local_2a0._4_4_ = SVar13;
  local_2a0._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_2a0._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_2a0._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_2a0._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_2a0._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_2a0._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_2a0._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_2a0._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_220 = LODMODE_EXACT;
  (**(code **)(lVar21 + 0xb8))(0x9009,pFVar22->texture->m_glTexture);
  (**(code **)(lVar21 + 0x1360))(0x9009,0x2801,this->m_minFilter);
  (**(code **)(lVar21 + 0x1360))(0x9009,0x2800,this->m_magFilter);
  (**(code **)(lVar21 + 0x1360))(0x9009,0x2802,this->m_wrapS);
  (**(code **)(lVar21 + 0x1360))(0x9009,0x2803,this->m_wrapT);
  (**(code **)(lVar21 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  local_208._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar4 = (ostringstream *)(local_208 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar4);
  local_2e0 = lVar21;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Coordinates: ",0xd);
  tcu::operator<<((ostream *)poVar4,&pFVar22->bottomLeft);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," -> ",4);
  tcu::operator<<((ostream *)poVar4,&pFVar22->topRight);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_190);
  poVar4 = (ostringstream *)(local_208 + 8);
  local_3a0 = 0;
  do {
    tcu::Surface::Surface(&result,viewport.width,viewport.height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCubeArray
              (&texCoord,(CubeFace)local_3a0,&pFVar22->bottomLeft,&pFVar22->topRight,
               &pFVar22->layerRange);
    local_208._0_8_ = local_360;
    this_00 = (ostringstream *)(local_208 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Face ",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,&DAT_00971374 + *(int *)(&DAT_00971374 + local_3a0 * 4),2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_208 + 8));
    std::ios_base::~ios_base(local_190);
    local_208._0_8_ = local_360;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_208 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_208 + 8),"Texture coordinates:",0x14);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_208 + 8));
    std::ios_base::~ios_base(local_190);
    uVar17 = (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    if (3 < uVar17) {
      lVar21 = 0xc;
      uVar18 = 0;
      do {
        local_33c = *(float *)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar21 + -0xc);
        local_340 = *(float *)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar21 + -8);
        local_344 = *(float *)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar21 + -4);
        local_348 = *(float *)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar21);
        local_208._0_8_ = local_360;
        std::__cxx11::ostringstream::ostringstream(poVar4);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,": (",3);
        std::ostream::_M_insert<double>((double)local_33c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,", ",2);
        std::ostream::_M_insert<double>((double)local_340);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,", ",2);
        std::ostream::_M_insert<double>((double)local_344);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,", ",2);
        std::ostream::_M_insert<double>((double)local_348);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar4);
        std::ios_base::~ios_base(local_190);
        uVar18 = uVar18 + 1;
        lVar21 = lVar21 + 0x10;
      } while (uVar17 >> 2 != uVar18);
    }
    gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_2a0);
    dVar11 = (**(code **)(local_2e0 + 0x800))();
    glu::checkError(dVar11,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFilteringTests.cpp"
                    ,0x173);
    y = viewport.y;
    iVar10 = viewport.x;
    local_398.coordBits.m_data[0] = 8;
    local_398.coordBits.m_data[1] = 3;
    pvVar20 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar20 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_208,(TextureFormat *)&local_398,result.m_width,
               result.m_height,1,pvVar20);
    glu::readPixels(local_2e8,iVar10,y,(PixelBufferAccess *)local_208);
    dVar11 = (**(code **)(local_2e0 + 0x800))();
    glu::checkError(dVar11,"Read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFilteringTests.cpp"
                    ,0x176);
    dVar11 = this->m_minFilter;
    dVar5 = this->m_magFilter;
    iVar10 = (*local_2e8->_vptr_RenderContext[4])();
    uVar12 = (dVar5 == 0x2600 && dVar11 == 0x2600) | 0xfffffffe;
    pixelFormat._0_8_ = *(undefined8 *)(CONCAT44(extraout_var_00,iVar10) + 8);
    pixelFormat._8_8_ = *(undefined8 *)(CONCAT44(extraout_var_00,iVar10) + 0x10);
    coordBits.m_data[0] = 10;
    coordBits.m_data[1] = 10;
    coordBits.m_data[2] = 10;
    coordBits.m_data[3] = 10;
    colorBits.m_data[0] =
         -(uint)(0 < (int)(uVar12 + pixelFormat.redBits)) & uVar12 + pixelFormat.redBits;
    colorBits.m_data[1] =
         -(uint)(0 < (int)(uVar12 + pixelFormat.greenBits)) & uVar12 + pixelFormat.greenBits;
    colorBits.m_data[2] =
         -(uint)(0 < (int)(uVar12 + pixelFormat.blueBits)) & uVar12 + pixelFormat.blueBits;
    colorBits.m_data[3] =
         -(uint)(0 < (int)(uVar12 + pixelFormat.alphaBits)) & uVar12 + pixelFormat.alphaBits;
    local_2f4.rule = RULE_OPENGL;
    local_398.coordBits.m_data[0] = 0x16;
    local_398.coordBits.m_data[1] = 0x16;
    local_398.coordBits.m_data[2] = 0x16;
    local_398.uvwBits.m_data[0] = 0x10;
    local_398.uvwBits.m_data[1] = 0x10;
    local_398.uvwBits.m_data[2] = 0x10;
    local_398.colorThreshold.m_data[0] = 0.0;
    local_398.colorThreshold.m_data[1] = 0.0;
    local_398.colorThreshold.m_data[2] = 0.0;
    local_398.colorThreshold.m_data[3] = 0.0;
    local_398.colorMask.m_data[0] = true;
    local_398.colorMask.m_data[1] = true;
    local_398.colorMask.m_data[2] = true;
    local_398.colorMask.m_data[3] = true;
    local_2f4.derivateBits = 10;
    local_2f4.lodBits = 5;
    tcu::computeFixedPointThreshold((tcu *)local_208,&colorBits);
    auVar8._8_8_ = local_208._8_8_;
    auVar8._0_8_ = local_208._0_8_;
    auVar7._8_8_ = local_2a0._44_8_;
    auVar7._0_8_ = local_2a0._36_8_;
    local_398.colorThreshold.m_data = (float  [4])divps(auVar8,auVar7);
    local_398.coordBits.m_data[0] = coordBits.m_data[0];
    local_398.coordBits.m_data[1] = coordBits.m_data[1];
    local_398.coordBits.m_data[2] = coordBits.m_data[2];
    local_398.uvwBits.m_data[0] = 6;
    local_398.uvwBits.m_data[1] = 6;
    local_398.uvwBits.m_data[2] = 6;
    auVar23._0_4_ = -(uint)(0 < pixelFormat.redBits);
    auVar23._4_4_ = -(uint)(0 < pixelFormat.greenBits);
    auVar23._8_4_ = -(uint)(0 < pixelFormat.blueBits);
    auVar23._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
    uVar12 = movmskps(6,auVar23);
    bVar15 = (byte)uVar12;
    local_398.colorMask.m_data =
         (bool  [4])
         (uVar12 & 1 | (uint)((bVar15 & 2) >> 1) << 8 | (uint)((bVar15 & 4) >> 2) << 0x10 |
         (uint)(bVar15 >> 3) << 0x18);
    pTVar19 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    local_358.m_numLevels = 8;
    local_358._4_4_ = 3;
    pvVar20 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar20 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_208,(TextureFormat *)&local_358,result.m_width,
               result.m_height,1,pvVar20);
    local_358.m_levels = (pFVar22->texture->m_refTexture).m_view.m_levels;
    local_358.m_numLevels = (pFVar22->texture->m_refTexture).m_view.m_numLevels;
    bVar9 = glu::TextureTestUtil::verifyTextureResult
                      (pTVar19,(ConstPixelBufferAccess *)local_208,&local_358,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_2a0,&local_398,
                       &coordBits,&local_2f4,&pixelFormat);
    if (!bVar9) {
      local_2f4.lodBits = 4;
      local_398.uvwBits.m_data[0] = 4;
      local_398.uvwBits.m_data[1] = 4;
      local_398.uvwBits.m_data[2] = 4;
      local_208._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_208 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_208 + 8),
                 "Warning: Verification against high precision requirements failed, trying with lower requirements."
                 ,0x61);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_208 + 8));
      std::ios_base::~ios_base(local_190);
      pTVar19 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      local_358.m_numLevels = 8;
      local_358._4_4_ = 3;
      pvVar20 = (void *)result.m_pixels.m_cap;
      if (result.m_pixels.m_cap != 0) {
        pvVar20 = result.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_208,(TextureFormat *)&local_358,result.m_width,
                 result.m_height,1,pvVar20);
      local_358.m_levels = (pFVar22->texture->m_refTexture).m_view.m_levels;
      local_358.m_numLevels = (pFVar22->texture->m_refTexture).m_view.m_numLevels;
      bVar9 = glu::TextureTestUtil::verifyTextureResult
                        (pTVar19,(ConstPixelBufferAccess *)local_208,&local_358,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_2a0,&local_398,
                         &coordBits,&local_2f4,&pixelFormat);
      if (bVar9) {
        pTVar19 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        if (pTVar19->m_testResult != QP_TEST_RESULT_PASS) goto LAB_004a504a;
        testResult = QP_TEST_RESULT_QUALITY_WARNING;
        description = "Low-quality filtering result";
      }
      else {
        local_208._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_208 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_208 + 8),
                   "ERROR: Verification against low precision requirements failed, failing test case."
                   ,0x51);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_208 + 8));
        std::ios_base::~ios_base(local_190);
        pTVar19 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        testResult = QP_TEST_RESULT_FAIL;
        description = "Image verification failed";
      }
      tcu::TestContext::setTestResult(pTVar19,testResult,description);
    }
LAB_004a504a:
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&result);
    uVar12 = (CubeFace)local_3a0 + CUBEFACE_POSITIVE_X;
    local_3a0 = (ulong)uVar12;
    if (uVar12 == 6) {
      iVar10 = this->m_caseNdx + 1;
      this->m_caseNdx = iVar10;
      pFVar22 = (this->m_cases).
                super__Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar6 = (this->m_cases).
               super__Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      tcu::TestLog::endSection(section.m_log);
      return (IterateResult)(iVar10 < (int)((ulong)((long)pFVar6 - (long)pFVar22) >> 5));
    }
  } while( true );
}

Assistant:

TextureCubeArrayFilteringCase::IterateResult TextureCubeArrayFilteringCase::iterate (void)
{
	TestLog&						log				= m_testCtx.getLog();
	const glu::RenderContext&		renderCtx		= m_context.getRenderContext();
	const glw::Functions&			gl				= renderCtx.getFunctions();
	const int						viewportSize	= 28;
	const deUint32					randomSeed		= deStringHash(getName()) ^ deInt32Hash(m_caseNdx) ^ m_testCtx.getCommandLine().getBaseSeed();
	const RandomViewport			viewport		(m_context.getRenderTarget(), viewportSize, viewportSize, randomSeed);
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	const tcu::TextureFormat		texFmt			= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams		(TEXTURETYPE_CUBE_ARRAY);

	if (viewport.width < viewportSize || viewport.height < viewportSize)
		throw tcu::NotSupportedError("Render target too small", "", __FILE__, __LINE__);

	// Params for reference computation.
	refParams.sampler					= glu::mapGLSampler(GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE, m_minFilter, m_magFilter);
	refParams.sampler.seamlessCubeMap	= true;
	refParams.samplerType				= getSamplerType(texFmt);
	refParams.colorBias					= fmtInfo.lookupBias;
	refParams.colorScale				= fmtInfo.lookupScale;
	refParams.lodMode					= LODMODE_EXACT;

	gl.bindTexture	(GL_TEXTURE_CUBE_MAP_ARRAY, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_T,		m_wrapT);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	m_testCtx.getLog() << TestLog::Message << "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight << TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(viewport.width, viewport.height);
		vector<float>			texCoord;

		computeQuadTexCoordCubeArray(texCoord, face, curCase.bottomLeft, curCase.topRight, curCase.layerRange);

		log << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		log << TestLog::Message << "Texture coordinates:" << TestLog::EndMessage;

		logCubeArrayTexCoords(log, texCoord);

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		glu::readPixels(renderCtx, viewport.x, viewport.y, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

		{
			const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
			const tcu::PixelFormat	pixelFormat		= renderCtx.getRenderTarget().getPixelFormat();
			const tcu::IVec4		coordBits		= tcu::IVec4(10);
			const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
			tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
			tcu::LookupPrecision	lookupPrecision;

			lodPrecision.derivateBits		= 10;
			lodPrecision.lodBits			= 5;
			lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
			lookupPrecision.coordBits		= coordBits.toWidth<3>();
			lookupPrecision.uvwBits			= tcu::IVec3(6);
			lookupPrecision.colorMask		= getCompareMask(pixelFormat);

			const bool isHighQuality = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
														   &texCoord[0], refParams, lookupPrecision, coordBits, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				// Evaluate against lower precision requirements.
				lodPrecision.lodBits	= 4;
				lookupPrecision.uvwBits	= tcu::IVec3(4);

				m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

				const bool isOk = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
													  &texCoord[0], refParams, lookupPrecision, coordBits, lodPrecision, pixelFormat);

				if (!isOk)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				}
				else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}